

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_week(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  int local_34;
  size_type sStack_30;
  int week;
  size_type checkpoint;
  int *value_local;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)value;
  value_local = (int *)pig;
  pig_local = (Pig *)this;
  sStack_30 = Pig::cursor(pig);
  bVar1 = Pig::getDigit2((Pig *)value_local,&local_34);
  if (((bVar1) && (0 < local_34)) && (local_34 < 0x36)) {
    *(int *)checkpoint = local_34;
    this_local._7_1_ = true;
  }
  else {
    Pig::restoreTo((Pig *)value_local,sStack_30);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Datetime::parse_week (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int week;
  if (pig.getDigit2 (week) &&
      week > 0             &&
      week <= 53)
  {
    value = week;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}